

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O1

DatatypeValidator * __thiscall
xercesc_4_0::DatatypeValidatorFactory::createDatatypeValidator
          (DatatypeValidatorFactory *this,XMLCh *typeName,
          RefVectorOf<xercesc_4_0::DatatypeValidator> *validators,int finalSet,bool userDefined,
          MemoryManager *userManager)

{
  XMLSize_t XVar1;
  bool bVar2;
  int iVar3;
  UnionDatatypeValidator *this_00;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *pRVar4;
  undefined4 extraout_var;
  DatatypeValidator *pDVar5;
  ValidatorType VVar6;
  ValidatorType VVar7;
  XMLSize_t XVar8;
  bool bVar9;
  bool bVar10;
  MemoryManager *manager;
  XMLSize_t i;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> **ppRVar11;
  bool bVar12;
  bool bVar13;
  
  if (validators == (RefVectorOf<xercesc_4_0::DatatypeValidator> *)0x0) {
    this_00 = (UnionDatatypeValidator *)0x0;
  }
  else {
    manager = userManager;
    if (!userDefined) {
      manager = XMLPlatformUtils::fgMemoryManager;
    }
    this_00 = (UnionDatatypeValidator *)XMemory::operator_new(0x80,manager);
    UnionDatatypeValidator::UnionDatatypeValidator(this_00,validators,finalSet,manager);
    if (userDefined) {
      ppRVar11 = &this->fUserDefinedRegistry;
      if (this->fUserDefinedRegistry ==
          (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0) {
        pRVar4 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
                 XMemory::operator_new(0x38,userManager);
        pRVar4->fMemoryManager = userManager;
        pRVar4->fAdoptedElems = true;
        pRVar4->fBucketList = (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)0x0;
        pRVar4->fHashModulus = 0x1d;
        pRVar4->fInitialModulus = 0x1d;
        pRVar4->fCount = 0;
        iVar3 = (*userManager->_vptr_MemoryManager[3])(userManager,0xe8);
        pRVar4->fBucketList =
             (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)CONCAT44(extraout_var,iVar3)
        ;
        XVar1 = pRVar4->fHashModulus;
        if (XVar1 != 0) {
          XVar8 = 0;
          do {
            pRVar4->fBucketList[XVar8] =
                 (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0;
            XVar8 = XVar8 + 1;
          } while (XVar1 != XVar8);
        }
        *ppRVar11 = pRVar4;
      }
    }
    else {
      ppRVar11 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> **)
                 &fBuiltInRegistry;
    }
    RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
              (*ppRVar11,typeName,(DatatypeValidator *)this_00);
    DatatypeValidator::setTypeName((DatatypeValidator *)this_00,typeName);
    XVar1 = (validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>).fCurCount;
    if (XVar1 == 0) {
      (this_00->super_DatatypeValidator).fOrdered = ORDERED_PARTIAL;
      (this_00->super_DatatypeValidator).fBounded = true;
      (this_00->super_DatatypeValidator).fNumeric = true;
      bVar9 = true;
    }
    else {
      pDVar5 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                         (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,0);
      VVar6 = pDVar5->fType;
      if (pDVar5->fType - ID < 3) {
        VVar6 = String;
      }
      bVar12 = VVar6 != AnySimpleType;
      bVar9 = true;
      XVar8 = 0;
      bVar2 = true;
      bVar10 = true;
      bVar13 = true;
      do {
        if (bVar12) {
          pDVar5 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                             (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                              XVar8);
          VVar7 = String;
          if (2 < pDVar5->fType - ID) {
            VVar7 = pDVar5->fType;
          }
          bVar12 = VVar6 == VVar7;
        }
        else if ((((!bVar13) && (!bVar10)) && (!bVar2)) && (!bVar9)) break;
        if (bVar13) {
          pDVar5 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                             (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                              XVar8);
          bVar13 = pDVar5->fOrdered == ORDERED_FALSE;
        }
        if (bVar10 != false) {
          pDVar5 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                             (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                              XVar8);
          if (pDVar5->fNumeric == false) {
            bVar10 = false;
          }
        }
        if (bVar2 != false) {
          pDVar5 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                             (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                              XVar8);
          if (pDVar5->fBounded == true) {
            pDVar5 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                XVar8);
            VVar7 = String;
            if (2 < pDVar5->fType - ID) {
              VVar7 = pDVar5->fType;
            }
            if (VVar6 == VVar7) goto LAB_002ff135;
          }
          bVar2 = false;
        }
LAB_002ff135:
        if (bVar9 != false) {
          pDVar5 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                             (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                              XVar8);
          if (pDVar5->fFinite == false) {
            bVar9 = false;
          }
        }
        XVar8 = XVar8 + 1;
      } while (XVar1 != XVar8);
      if (bVar12) {
        pDVar5 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                           (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,0);
        (this_00->super_DatatypeValidator).fOrdered = pDVar5->fOrdered;
      }
      else if (bVar13) {
        (this_00->super_DatatypeValidator).fOrdered = ORDERED_FALSE;
      }
      else {
        (this_00->super_DatatypeValidator).fOrdered = ORDERED_PARTIAL;
      }
      (this_00->super_DatatypeValidator).fNumeric = bVar10;
      (this_00->super_DatatypeValidator).fBounded = bVar2;
    }
    (this_00->super_DatatypeValidator).fFinite = bVar9;
  }
  return &this_00->super_DatatypeValidator;
}

Assistant:

DatatypeValidator* DatatypeValidatorFactory::createDatatypeValidator
(
      const XMLCh* const                    typeName
    , RefVectorOf<DatatypeValidator>* const validators
    , const int                             finalSet
    , const bool                            userDefined
    , MemoryManager* const                  userManager
)
{
    if (validators == 0)
        return 0;

    DatatypeValidator* datatypeValidator = 0;
    MemoryManager* const manager = (userDefined)
        ? userManager : XMLPlatformUtils::fgMemoryManager;

    datatypeValidator = new (manager) UnionDatatypeValidator(validators, finalSet, manager);

    if (datatypeValidator != 0) {

        if (userDefined) {

            if (!fUserDefinedRegistry) {
                fUserDefinedRegistry = new (userManager) RefHashTableOf<DatatypeValidator>(29, userManager);
            }

            fUserDefinedRegistry->put((void *)typeName, datatypeValidator);
        }
        else {
            fBuiltInRegistry->put((void *)typeName, datatypeValidator);
        }
        datatypeValidator->setTypeName(typeName);

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        XMLSize_t valSize = validators->size();
        if (valSize)
        {
            DatatypeValidator::ValidatorType ancestorId = getPrimitiveDV(validators->elementAt(0)->getType());

            // For a union the ORDERED {value} is partial unless one of the following:
            // 1. If every member of {member type definitions} is derived from a common ancestor other than the simple ur-type, then {value} is the same as that ancestor's ordered facet.
            // 2. If every member of {member type definitions} has a {value} of false for the ordered facet, then {value} is false.
            bool allOrderedFalse = true;
            bool commonAnc = ancestorId != DatatypeValidator::AnySimpleType;
            bool allNumeric = true;
            bool allBounded = true;
            bool allFinite  = true;

            for(XMLSize_t i = 0 ; (i < valSize) && (commonAnc || allOrderedFalse || allNumeric || allBounded || allFinite); i++)
            {
                // for the other member types, check whether the value is false
                // and whether they have the same ancestor as the first one
                if (commonAnc)
                    commonAnc = ancestorId == getPrimitiveDV(validators->elementAt(i)->getType());
                if (allOrderedFalse)
                    allOrderedFalse = validators->elementAt(i)->getOrdered() == XSSimpleTypeDefinition::ORDERED_FALSE;

                if (allNumeric && !validators->elementAt(i)->getNumeric())
                {
                    allNumeric = false;
                }
                if (allBounded && (!validators->elementAt(i)->getBounded() ||
                                   ancestorId != getPrimitiveDV(validators->elementAt(i)->getType())))
                {
                    allBounded = false;
                }
                if (allFinite && !validators->elementAt(i)->getFinite())
                {
                    allFinite = false;
                }
            }
            if (commonAnc)
            {
                datatypeValidator->setOrdered(validators->elementAt(0)->getOrdered());
            }
            else if (allOrderedFalse)
            {
                datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_FALSE);
            }
            else
            {
                datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_PARTIAL);
            }
            datatypeValidator->setNumeric(allNumeric);
            datatypeValidator->setBounded(allBounded);
            datatypeValidator->setFinite(allFinite);
        }
        else // size = 0
        {
            datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_PARTIAL);
            datatypeValidator->setNumeric(true);
            datatypeValidator->setBounded(true);
            datatypeValidator->setFinite(true);
        }
    }
    return datatypeValidator;
}